

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O1

void __thiscall
PolicyPureVector::PolicyPureVector
          (PolicyPureVector *this,Interface_ProblemToPolicyDiscretePure *pu,Index agentI,
          PolicyDomainCategory idc,size_t depth)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  allocator_type local_3d;
  value_type_conflict1 local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  PolicyDiscretePure::PolicyDiscretePure((PolicyDiscretePure *)this,pu,idc,agentI);
  *(undefined ***)this = &PTR__PolicyPureVector_005aecd8;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = *(long *)&this->field_0x18;
  if (lVar3 == 0) {
    lVar3 = *(long *)&this->field_0x20;
  }
  plVar2 = (long *)__dynamic_cast(lVar3,&Interface_ProblemToPolicyDiscrete::typeinfo,
                                  &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
  uVar1 = (**(code **)(*plVar2 + 0x28))(plVar2,agentI,*(undefined4 *)&this->field_0x30,depth);
  this->_m_agentI = agentI;
  local_3c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,(ulong)uVar1,&local_3c,&local_3d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->_m_domainToActionIndices,&local_38);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

PolicyPureVector::PolicyPureVector(
    const Interface_ProblemToPolicyDiscretePure* pu,
    Index agentI,
    PolicyGlobals::PolicyDomainCategory idc,
    size_t depth
        ) :
     PolicyDiscretePure(pu,idc, agentI)
{
    Index nrDE = GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(agentI, GetPolicyDomainCategory(), depth);
    if(DEBUG_PPV)
        cout << "PolicyPureVector(): creating policy for agent "<<agentI
             << ", depth " << depth << " (nr domain elements "
             << nrDE << ")" << endl;

    _m_agentI = agentI;
    _m_domainToActionIndices = vector<Index>(nrDE, 0);
}